

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O3

void __thiscall FDrawInfo::StartScene(FDrawInfo *this)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  
  ClearBuffers(this);
  iVar2 = numsectors;
  puVar1 = &(this->sectorrenderflags).Count;
  uVar4 = numsectors - *puVar1;
  if (*puVar1 <= (uint)numsectors && uVar4 != 0) {
    TArray<unsigned_char,_unsigned_char>::Grow(&this->sectorrenderflags,uVar4);
  }
  (this->sectorrenderflags).Count = iVar2;
  iVar2 = numsubsectors;
  puVar1 = &(this->ss_renderflags).Count;
  uVar4 = numsubsectors - *puVar1;
  if (*puVar1 <= (uint)numsubsectors && uVar4 != 0) {
    TArray<unsigned_char,_unsigned_char>::Grow(&this->ss_renderflags,uVar4);
  }
  iVar3 = numsubsectors;
  (this->ss_renderflags).Count = iVar2;
  puVar1 = &(this->no_renderflags).Count;
  uVar4 = iVar3 - *puVar1;
  if (*puVar1 <= (uint)iVar3 && uVar4 != 0) {
    TArray<unsigned_char,_unsigned_char>::Grow(&this->no_renderflags,uVar4);
  }
  (this->no_renderflags).Count = iVar3;
  memset((this->sectorrenderflags).Array,0,(long)numsectors);
  memset((this->ss_renderflags).Array,0,(long)numsubsectors);
  memset((this->no_renderflags).Array,0,(long)numnodes);
  this->next = gl_drawinfo;
  lVar5 = 0xe0;
  gl_drawinfo = this;
  do {
    GLDrawList::Reset((GLDrawList *)(&this->temporary + lVar5));
    lVar5 = lVar5 + 0x58;
  } while (lVar5 != 0x3a0);
  if (this->dldrawlists != (GLDrawList *)0x0) {
    lVar5 = 0;
    do {
      GLDrawList::Reset((GLDrawList *)((long)&(this->dldrawlists->walls).Array + lVar5));
      lVar5 = lVar5 + 0x58;
    } while (lVar5 != 0x2c0);
  }
  return;
}

Assistant:

void FDrawInfo::StartScene()
{
	ClearBuffers();

	sectorrenderflags.Resize(numsectors);
	ss_renderflags.Resize(numsubsectors);
	no_renderflags.Resize(numsubsectors);

	memset(&sectorrenderflags[0], 0, numsectors * sizeof(sectorrenderflags[0]));
	memset(&ss_renderflags[0], 0, numsubsectors * sizeof(ss_renderflags[0]));
	memset(&no_renderflags[0], 0, numnodes * sizeof(no_renderflags[0]));

	next = gl_drawinfo;
	gl_drawinfo = this;
	for (int i = 0; i < GLDL_TYPES; i++) drawlists[i].Reset();
	if (dldrawlists != NULL)
	{
		for (int i = 0; i < GLLDL_TYPES; i++) dldrawlists[i].Reset();
	}
}